

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O1

Bounds3f * __thiscall
pbrt::AnimatedTransform::BoundPointMotion
          (Bounds3f *__return_storage_ptr__,AnimatedTransform *this,Point3f p)

{
  undefined8 uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  long lVar9;
  undefined8 in_R8;
  long lVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [56];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar19 [60];
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  float fVar29;
  Point3f PVar30;
  span<float> zeros_00;
  int nZeros;
  Float local_d0;
  int va;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  Bounds3f *local_a0;
  undefined1 local_98 [16];
  DerivativeTerm *local_80;
  DerivativeTerm *local_78;
  unsigned_long vb;
  undefined1 local_68 [16];
  Float zeros [8];
  undefined1 auVar18 [64];
  
  auVar17._4_60_ = p._12_60_;
  auVar17._0_4_ = p.super_Tuple3<pbrt::Point3,_float>.z;
  auVar14._8_56_ = p._8_56_;
  auVar14._0_8_ = p.super_Tuple3<pbrt::Point3,_float>._0_8_;
  local_98 = auVar14._0_16_;
  local_68 = vmovshdup_avx(local_98);
  fVar29 = local_68._0_4_;
  auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * (this->startTransform).m.m[0][1])),local_98,
                            ZEXT416((uint)(this->startTransform).m.m[0][0]));
  auVar13 = auVar17._0_16_;
  auVar24 = vfmadd231ss_fma(auVar24,auVar13,ZEXT416((uint)(this->startTransform).m.m[0][2]));
  fVar11 = auVar24._0_4_ + (this->startTransform).m.m[0][3];
  auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * (this->startTransform).m.m[1][1])),local_98,
                            ZEXT416((uint)(this->startTransform).m.m[1][0]));
  auVar24 = vfmadd231ss_fma(auVar24,auVar13,ZEXT416((uint)(this->startTransform).m.m[1][2]));
  fVar20 = auVar24._0_4_ + (this->startTransform).m.m[1][3];
  auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * (this->startTransform).m.m[2][1])),local_98,
                            ZEXT416((uint)(this->startTransform).m.m[2][0]));
  auVar24 = vfmadd231ss_fma(auVar24,auVar13,ZEXT416((uint)(this->startTransform).m.m[2][2]));
  fVar7 = auVar24._0_4_ + (this->startTransform).m.m[2][3];
  auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * (this->startTransform).m.m[3][1])),local_98,
                            ZEXT416((uint)(this->startTransform).m.m[3][0]));
  auVar24 = vfmadd231ss_fma(auVar24,auVar13,ZEXT416((uint)(this->startTransform).m.m[3][2]));
  fVar8 = auVar24._0_4_ + (this->startTransform).m.m[3][3];
  bVar6 = fVar8 == 1.0;
  auVar24 = vinsertps_avx(ZEXT416((uint)bVar6 * (int)fVar11 + (uint)!bVar6 * (int)(fVar11 / fVar8)),
                          ZEXT416((uint)bVar6 * (int)fVar20 + (uint)!bVar6 * (int)(fVar20 / fVar8)),
                          0x10);
  fVar11 = (float)((uint)bVar6 * (int)fVar7 + (uint)!bVar6 * (int)(fVar7 / fVar8));
  local_a0 = __return_storage_ptr__;
  if (this->actuallyAnimated == false) {
    uVar1 = vmovlps_avx(auVar24);
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.y =
         (float)(int)((ulong)uVar1 >> 0x20);
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.z = fVar11;
    uVar1 = vmovlps_avx(auVar24);
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.y =
         (float)(int)((ulong)uVar1 >> 0x20);
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.z = fVar11;
  }
  else {
    auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * (this->endTransform).m.m[0][1])),local_98,
                              ZEXT416((uint)(this->endTransform).m.m[0][0]));
    auVar21 = vfmadd231ss_fma(auVar21,auVar13,ZEXT416((uint)(this->endTransform).m.m[0][2]));
    fVar20 = auVar21._0_4_ + (this->endTransform).m.m[0][3];
    auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * (this->endTransform).m.m[1][1])),local_98,
                              ZEXT416((uint)(this->endTransform).m.m[1][0]));
    auVar21 = vfmadd231ss_fma(auVar21,auVar13,ZEXT416((uint)(this->endTransform).m.m[1][2]));
    fVar7 = auVar21._0_4_ + (this->endTransform).m.m[1][3];
    auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * (this->endTransform).m.m[2][1])),local_98,
                              ZEXT416((uint)(this->endTransform).m.m[2][0]));
    auVar21 = vfmadd231ss_fma(auVar21,auVar13,ZEXT416((uint)(this->endTransform).m.m[2][2]));
    fVar8 = auVar21._0_4_ + (this->endTransform).m.m[2][3];
    auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * (this->endTransform).m.m[3][1])),local_98,
                              ZEXT416((uint)(this->endTransform).m.m[3][0]));
    auVar13 = vfmadd231ss_fma(auVar21,auVar13,ZEXT416((uint)(this->endTransform).m.m[3][2]));
    fVar29 = auVar13._0_4_ + (this->endTransform).m.m[3][3];
    bVar6 = fVar29 == 1.0;
    auVar12 = ZEXT416((uint)bVar6 * (int)fVar8 + (uint)!bVar6 * (int)(fVar8 / fVar29));
    auVar13 = vinsertps_avx(ZEXT416((uint)bVar6 * (int)fVar20 +
                                    (uint)!bVar6 * (int)(fVar20 / fVar29)),
                            ZEXT416((uint)bVar6 * (int)fVar7 + (uint)!bVar6 * (int)(fVar7 / fVar29))
                            ,0x10);
    auVar21 = vminps_avx(auVar13,auVar24);
    auVar16 = vminss_avx(auVar12,ZEXT416((uint)fVar11));
    uVar1 = vmovlps_avx(auVar21);
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.y =
         (float)(int)((ulong)uVar1 >> 0x20);
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.z = auVar16._0_4_;
    auVar24 = vmaxps_avx(auVar13,auVar24);
    auVar13 = vmaxss_avx(auVar12,ZEXT416((uint)fVar11));
    uVar1 = vmovlps_avx(auVar24);
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.y =
         (float)(int)((ulong)uVar1 >> 0x20);
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.z = auVar13._0_4_;
    uVar2._0_4_ = this->R[0].v.super_Tuple3<pbrt::Vector3,_float>.x;
    uVar2._4_4_ = this->R[0].v.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar2;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = *(ulong *)&this->R[0].v.super_Tuple3<pbrt::Vector3,_float>.z;
    uVar3._0_4_ = this->R[1].v.super_Tuple3<pbrt::Vector3,_float>.x;
    uVar3._4_4_ = this->R[1].v.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar3;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = *(ulong *)&this->R[1].v.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar24._0_4_ = (float)(undefined4)uVar2 * (float)(undefined4)uVar3;
    auVar24._4_4_ = (float)uVar2._4_4_ * (float)uVar3._4_4_;
    auVar24._8_8_ = 0;
    auVar24 = vmovshdup_avx(auVar24);
    auVar24 = vfmadd231ss_fma(auVar24,auVar13,auVar21);
    auVar21 = vfmadd231ss_fma(auVar24,auVar16,auVar12);
    auVar24 = vmovshdup_avx(auVar16);
    auVar13 = vmovshdup_avx(auVar12);
    auVar13 = vfmadd213ss_fma(auVar13,auVar24,auVar21);
    auVar24 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar13);
    uVar1 = vcmpss_avx512f(auVar13,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar6 = (bool)((byte)uVar1 & 1);
    local_d0 = acosf((float)((uint)bVar6 * -0x40800000 + (uint)!bVar6 * auVar24._0_4_));
    auVar28 = ZEXT1664(local_98);
    local_78 = this->c1;
    local_80 = this->c2;
    auVar22 = ZEXT464((uint)(__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.z);
    auVar14 = ZEXT464((uint)(__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.z);
    uVar4._0_4_ = (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.x;
    uVar4._4_4_ = (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.y;
    auVar25 = ZEXT864(uVar4);
    uVar5._0_4_ = (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.x;
    uVar5._4_4_ = (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.y;
    auVar23 = ZEXT864(uVar5);
    lVar10 = 0;
    do {
      local_c8 = auVar25._0_16_;
      local_b8 = auVar23._0_16_;
      fVar20 = auVar22._0_4_;
      fVar11 = auVar14._0_4_;
      nZeros = 0;
      auVar27 = auVar28._0_16_;
      auVar24 = vfmadd213ss_fma(ZEXT416((uint)local_78[lVar10].kx),auVar27,
                                ZEXT416((uint)local_78[lVar10].kc));
      auVar24 = vfmadd231ss_fma(auVar24,local_68,ZEXT416((uint)local_78[lVar10].ky));
      auVar26 = ZEXT416((uint)auVar17._0_4_);
      auVar13 = vfmadd231ss_fma(auVar24,auVar26,ZEXT416((uint)local_78[lVar10].kz));
      auVar24 = vfmadd213ss_fma(ZEXT416((uint)local_80[lVar10].kx),auVar27,
                                ZEXT416((uint)local_80[lVar10].kc));
      auVar24 = vfmadd231ss_fma(auVar24,local_68,ZEXT416((uint)local_80[lVar10].ky));
      auVar21 = vfmadd231ss_fma(auVar24,auVar26,ZEXT416((uint)local_80[lVar10].kz));
      auVar24 = vfmadd213ss_fma(ZEXT416((uint)this->c3[lVar10].kx),auVar27,
                                ZEXT416((uint)this->c3[lVar10].kc));
      auVar24 = vfmadd231ss_fma(auVar24,local_68,ZEXT416((uint)this->c3[lVar10].ky));
      auVar16 = vfmadd231ss_fma(auVar24,auVar26,ZEXT416((uint)this->c3[lVar10].kz));
      auVar24 = vfmadd213ss_fma(ZEXT416((uint)this->c4[lVar10].kx),auVar27,
                                ZEXT416((uint)this->c4[lVar10].kc));
      auVar24 = vfmadd231ss_fma(auVar24,local_68,ZEXT416((uint)this->c4[lVar10].ky));
      auVar12 = vfmadd231ss_fma(auVar24,auVar26,ZEXT416((uint)this->c4[lVar10].kz));
      auVar24 = vfmadd213ss_fma(ZEXT416((uint)this->c5[lVar10].kx),auVar27,
                                ZEXT416((uint)this->c5[lVar10].kc));
      auVar24 = vfmadd231ss_fma(auVar24,local_68,ZEXT416((uint)this->c5[lVar10].ky));
      auVar24 = vfmadd231ss_fma(auVar24,auVar26,ZEXT416((uint)this->c5[lVar10].kz));
      zeros_00.n = (size_t)&nZeros;
      zeros_00.ptr = (float *)0x8;
      FindZeros((AnimatedTransform *)zeros,auVar13._0_4_,auVar21._0_4_,auVar16._0_4_,auVar12._0_4_,
                auVar24._0_4_,local_d0,(Interval)0x3f80000000000000,zeros_00,(int *)0x8,(int)in_R8);
      va = nZeros;
      vb = 8;
      if (8 < (uint)nZeros) {
        uVar1 = vmovlps_avx(local_c8);
        (local_a0->pMin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
        (local_a0->pMin).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
        uVar1 = vmovlps_avx(local_b8);
        (local_a0->pMax).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
        (local_a0->pMax).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
        (local_a0->pMin).super_Tuple3<pbrt::Point3,_float>.z = fVar20;
        (local_a0->pMax).super_Tuple3<pbrt::Point3,_float>.z = fVar11;
        LogFatal<char_const(&)[7],char_const(&)[49],char_const(&)[7],int&,char_const(&)[49],unsigned_long&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/transform.cpp"
                   ,0x458,"Check failed: %s <= %s with %s = %s, %s = %s",(char (*) [7])"nZeros",
                   (char (*) [49])"(sizeof(::pbrt::detail::ArraySizeHelper(zeros)))",
                   (char (*) [7])"nZeros",&va,
                   (char (*) [49])"(sizeof(::pbrt::detail::ArraySizeHelper(zeros)))",&vb);
      }
      if (nZeros < 1) {
        auVar28 = ZEXT1664(local_98);
        auVar14 = ZEXT464((uint)fVar11);
        auVar22 = ZEXT464((uint)fVar20);
        auVar23 = ZEXT1664(local_b8);
        auVar25 = ZEXT1664(local_c8);
      }
      else {
        lVar9 = 0;
        auVar28 = ZEXT1664(local_98);
        auVar14 = ZEXT464((uint)fVar11);
        auVar22 = ZEXT464((uint)fVar20);
        auVar23 = ZEXT1664(local_b8);
        auVar25 = ZEXT1664(local_c8);
        do {
          local_c8 = auVar25._0_16_;
          local_b8 = auVar23._0_16_;
          auVar24 = vfmadd231ss_fma(ZEXT416((uint)(zeros[lVar9] * this->endTime)),
                                    ZEXT416((uint)(1.0 - zeros[lVar9])),
                                    ZEXT416((uint)this->startTime));
          PVar30.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar28._0_8_;
          PVar30.super_Tuple3<pbrt::Point3,_float>.z = auVar17._0_4_;
          auVar19 = ZEXT1260((undefined1  [12])0x0);
          auVar15 = ZEXT856(auVar28._8_8_);
          PVar30 = operator()(this,PVar30,auVar24._0_4_);
          auVar18._0_4_ = PVar30.super_Tuple3<pbrt::Point3,_float>.z;
          auVar18._4_60_ = auVar19;
          auVar23._0_8_ = PVar30.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar23._8_56_ = auVar15;
          auVar28 = ZEXT1664(local_98);
          auVar24 = vminps_avx(auVar23._0_16_,local_c8);
          auVar25 = ZEXT1664(auVar24);
          auVar24 = vminss_avx(auVar18._0_16_,ZEXT416(auVar22._0_4_));
          auVar22 = ZEXT1664(auVar24);
          auVar24 = vmaxps_avx(auVar23._0_16_,local_b8);
          auVar23 = ZEXT1664(auVar24);
          auVar24 = vmaxss_avx(auVar18._0_16_,ZEXT416(auVar14._0_4_));
          auVar14 = ZEXT1664(auVar24);
          lVar9 = lVar9 + 1;
        } while (lVar9 < nZeros);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    uVar1 = vmovlps_avx(auVar25._0_16_);
    (local_a0->pMin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
    (local_a0->pMin).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
    uVar1 = vmovlps_avx(auVar23._0_16_);
    (local_a0->pMax).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
    (local_a0->pMax).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
    (local_a0->pMin).super_Tuple3<pbrt::Point3,_float>.z = auVar22._0_4_;
    (local_a0->pMax).super_Tuple3<pbrt::Point3,_float>.z = auVar14._0_4_;
  }
  return local_a0;
}

Assistant:

Bounds3f AnimatedTransform::BoundPointMotion(Point3f p) const {
    if (!actuallyAnimated)
        return Bounds3f(startTransform(p));
    Bounds3f bounds(startTransform(p), endTransform(p));
    Float cosTheta = Dot(R[0], R[1]);
    Float theta = SafeACos(cosTheta);
    for (int c = 0; c < 3; ++c) {
        // Find any motion derivative zeros for the component _c_
        Float zeros[8];
        int nZeros = 0;
        FindZeros(c1[c].Eval(p), c2[c].Eval(p), c3[c].Eval(p), c4[c].Eval(p),
                  c5[c].Eval(p), theta, Interval(0., 1.), zeros, &nZeros);
        CHECK_LE(nZeros, PBRT_ARRAYSIZE(zeros));

        // Expand bounding box for any motion derivative zeros found
        for (int i = 0; i < nZeros; ++i) {
            Point3f pz = (*this)(p, Lerp(zeros[i], startTime, endTime));
            bounds = Union(bounds, pz);
        }
    }
    return bounds;
}